

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  CURLINFO CVar1;
  writeoutid wVar2;
  int iVar3;
  char *pcVar4;
  char *strinfo;
  long version;
  char *local_30;
  ulong local_28;
  
  local_30 = (char *)0x0;
  CVar1 = wovar->ci;
  if (CVar1 == CURLINFO_NONE) {
    wVar2 = wovar->id;
    if (wVar2 == VAR_EFFECTIVE_FILENAME) {
      pcVar4 = (per->outs).filename;
    }
    else {
      if (wVar2 != VAR_INPUT_URL) {
        if ((wVar2 == VAR_ERRORMSG) && (per_result != CURLE_OK)) {
          if (per->errorbuffer[0] == '\0') {
            pcVar4 = (char *)curl_easy_strerror(per_result);
          }
          else {
            pcVar4 = per->errorbuffer;
          }
          goto LAB_0011c0d0;
        }
        goto LAB_0011c0ff;
      }
      pcVar4 = per->this_url;
    }
    if (pcVar4 != (char *)0x0) goto LAB_0011c0d0;
  }
  else if (CVar1 == CURLINFO_HTTP_VERSION) {
    local_28 = 0;
    iVar3 = curl_easy_getinfo(per->curl,0x20002e,&local_28);
    if (local_28 < 5 && iVar3 == 0) {
      pcVar4 = http_version[local_28];
LAB_0011c0d0:
      local_30 = pcVar4;
      pcVar4 = local_30;
      if (use_json) {
        curl_mfprintf(stream,"\"%s\":\"",wovar->name);
        jsonWriteString(stream,local_30);
        pcVar4 = "\"";
      }
      fputs(pcVar4,(FILE *)stream);
      return 1;
    }
  }
  else {
    iVar3 = curl_easy_getinfo(per->curl,CVar1,&local_30);
    pcVar4 = local_30;
    if (local_30 != (char *)0x0 && iVar3 == 0) goto LAB_0011c0d0;
  }
LAB_0011c0ff:
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version) &&
         (version >= 0) &&
         (version < (long)(sizeof(http_version)/sizeof(http_version[0])))) {
        strinfo = http_version[version];
        valid = true;
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = per->errorbuffer[0] ? per->errorbuffer :
                  curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->this_url) {
        strinfo = per->this_url;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    DEBUGASSERT(strinfo);
    if(use_json) {
      fprintf(stream, "\"%s\":\"", wovar->name);
      jsonWriteString(stream, strinfo);
      fputs("\"", stream);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}